

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall TypeTest_ModuleTypePrinter_Test::TestBody(TypeTest_ModuleTypePrinter_Test *this)

{
  pointer *this_00;
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *this_01;
  Printed PVar1;
  Printed PVar2;
  Printed PVar3;
  Printed PVar4;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  mapped_type *this_02;
  char *in_R9;
  pointer puVar5;
  char *pcVar6;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  undefined1 auStack_828 [8];
  Module module;
  stringstream stream;
  undefined1 local_428 [8];
  size_type local_420;
  __node_base local_418;
  size_type sStack_410;
  _Prime_rehash_policy local_408;
  __node_base_ptr ap_Stack_3f8 [41];
  Printed local_2b0;
  Printed local_288;
  Printed local_260;
  Printed local_238;
  undefined1 local_210 [8];
  ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> printDefault;
  BuildResult result;
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> fallback;
  ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
  printIndexed;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  TypeBuilder builder;
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)this_00,2);
  ::wasm::TypeBuilder::createRecGroup((ulong)this_00,0);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       '\x02';
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ = 0;
  fallback.defaultGenerator.funcCount = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)
                 ((long)&result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 + 0x18);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket,__l,
             (allocator_type *)&fallback.names._M_h._M_single_bucket);
  auStack_828 = (undefined1  [8])module.tagsMap._M_h._M_single_bucket;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = _stream;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_428;
  module.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _stream = (pointer)0x0;
  local_428 = (undefined1  [8])0x0;
  printDefault.wasm = (Module *)0x0;
  local_210 = (undefined1  [8])this_00;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)local_210,(Struct *)auStack_828);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_828);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       '\x02';
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ = 0;
  fallback.defaultGenerator.funcCount = 0;
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       ((long)&result.
               super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .
               super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error> + 0x18)
  ;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket,__l_00,
             (allocator_type *)&fallback.names._M_h._M_single_bucket);
  auStack_828 = (undefined1  [8])module.tagsMap._M_h._M_single_bucket;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = _stream;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_428;
  local_428 = (undefined1  [8])0x0;
  module.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _stream = (pointer)0x0;
  printDefault.wasm = (Module *)0x1;
  local_210 = (undefined1  [8])this_00;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)local_210,(Struct *)auStack_828);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_828);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket);
  ::wasm::TypeBuilder::build();
  _stream = (pointer)0x0;
  module.tagsMap._M_h._M_single_bucket =
       (__node_base_ptr)
       CONCAT71(module.tagsMap._M_h._M_single_bucket._1_7_,
                result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u._M_first._M_storage._M_storage[0x10] == '\0');
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stream);
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&printDefault.fallback);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&printIndexed.fallback,__x
              );
    ::wasm::Module::Module((Module *)auStack_828);
    ::wasm::Name::Name((Name *)&module.tagsMap._M_h._M_single_bucket,"A");
    local_428 = (undefined1  [8])ap_Stack_3f8;
    local_420 = 1;
    local_418._M_nxt = (_Hash_node_base *)0x0;
    sStack_410 = 0;
    local_408._M_max_load_factor = 1.0;
    local_408._4_4_ = 0;
    local_408._M_next_resize = 0;
    ap_Stack_3f8[0] = (__node_base_ptr)0x0;
    this_02 = std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&module.name.super_IString.str._M_str,
                           (key_type *)printIndexed.fallback);
    ::wasm::TypeNames::operator=(this_02,(TypeNames *)&module.tagsMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_428);
    printDefault.defaultGenerator.nameCache._M_h._M_single_bucket = (__node_base_ptr)&printDefault;
    printDefault.defaultGenerator.arrayCount =
         (size_t)&printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
    printDefault.wasm = (Module *)0x0;
    printDefault.defaultGenerator.funcCount = 0;
    printDefault.defaultGenerator.contCount = 0;
    printDefault.defaultGenerator.structCount = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
    printDefault.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    printDefault.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
    local_210 = (undefined1  [8])auStack_828;
    std::__cxx11::stringstream::stringstream((stringstream *)&module.tagsMap._M_h._M_single_bucket);
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_2b0,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_210,(HeapType)((printIndexed.fallback)->defaultGenerator).funcCount);
    PVar1.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar1.typeID = (TypeID)auStack_828;
    PVar1.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar1.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar1.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar1);
    std::_Function_base::~_Function_base(&local_2b0.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)&fallback.names._M_h._M_single_bucket,"stream.str()",
               "\"(type $A (struct (field i32)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18),(char (*) [31])"(type $A (struct (field i32)))");
    std::__cxx11::string::~string
              ((string *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    if ((char)fallback.names._M_h._M_single_bucket == '\0') {
      testing::Message::Message
                ((Message *)
                 ((long)&result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 + 0x18));
      if (printIndexed.wasm == (Module *)0x0) {
        puVar5 = (pointer)0x25ec52;
      }
      else {
        puVar5 = ((printIndexed.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x91,(char *)puVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_50,
                 (Message *)
                 ((long)&result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 + 0x18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
          != 0) {
        (**(code **)(*(long *)result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              ._24_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printIndexed);
    puVar5 = (pointer)0x25ec52;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18),"",(allocator<char> *)&fallback.names._M_h._M_single_bucket);
    std::__cxx11::stringbuf::str((string *)&local_420);
    std::__cxx11::string::~string
              ((string *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_288,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_210,(HeapType)((printIndexed.fallback)->defaultGenerator).contCount);
    PVar2.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar2.typeID = (TypeID)auStack_828;
    PVar2.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar2.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar2.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar2);
    std::_Function_base::~_Function_base(&local_288.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[38]>
              ((internal *)&fallback.names._M_h._M_single_bucket,"stream.str()",
               "\"(type $struct.0 (struct (field i32)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18),(char (*) [38])"(type $struct.0 (struct (field i32)))");
    std::__cxx11::string::~string
              ((string *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    if ((char)fallback.names._M_h._M_single_bucket == '\0') {
      testing::Message::Message
                ((Message *)
                 ((long)&result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 + 0x18));
      if (printIndexed.wasm != (Module *)0x0) {
        puVar5 = ((printIndexed.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x95,(char *)puVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_50,
                 (Message *)
                 ((long)&result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 + 0x18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
          != 0) {
        (**(code **)(*(long *)result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              ._24_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printIndexed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fallback.names._M_h._M_single_bucket,"",(allocator<char> *)&local_50);
    this_01 = (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)
              ((long)&result.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
              + 0x18);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              (this_01,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &printIndexed.fallback,(string *)&fallback.names._M_h._M_single_bucket);
    std::__cxx11::string::~string((string *)&fallback.names._M_h._M_single_bucket);
    printIndexed.defaultGenerator.arrayCount =
         (size_t)&printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
    printIndexed.wasm = (Module *)0x0;
    printIndexed.defaultGenerator.funcCount = 0;
    printIndexed.defaultGenerator.contCount = 0;
    printIndexed.defaultGenerator.structCount = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
    printIndexed.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    printIndexed.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
    pcVar6 = "";
    fallback.names._M_h._M_single_bucket = (__node_base_ptr)auStack_828;
    printIndexed.defaultGenerator.nameCache._M_h._M_single_bucket = (__node_base_ptr)this_01;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&builder);
    std::__cxx11::stringbuf::str((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_50);
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_260,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)&fallback.names._M_h._M_single_bucket,
                 (HeapType)((printIndexed.fallback)->defaultGenerator).funcCount);
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar3.typeID = (TypeID)auStack_828;
    PVar3.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar3.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar3.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar3);
    std::_Function_base::~_Function_base(&local_260.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)&builder,"stream.str()","\"(type $A (struct (field i32)))\"",&local_50,
               (char (*) [31])"(type $A (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_50);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar_2._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar_2._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x9d,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2.message_,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_2);
    pcVar6 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&builder);
    std::__cxx11::stringbuf::str((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_50);
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_238,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)&fallback.names._M_h._M_single_bucket,
                 (HeapType)((printIndexed.fallback)->defaultGenerator).contCount);
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar4.typeID = (TypeID)auStack_828;
    PVar4.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar4.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar4.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar4);
    std::_Function_base::~_Function_base(&local_238.generateName.super__Function_base);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)&builder,"stream.str()","\"(type $1 (struct (field i32)))\"",&local_50,
               (char (*) [31])"(type $1 (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_50);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar_2._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar_2._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xa1,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2.message_,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_2);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printIndexed.defaultGenerator.arrayCount);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    std::__cxx11::stringstream::~stringstream((stringstream *)&module.tagsMap._M_h._M_single_bucket)
    ;
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printDefault.defaultGenerator.arrayCount);
    ::wasm::Module::~Module((Module *)auStack_828);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &printIndexed.fallback);
  }
  else {
    testing::Message::Message
              ((Message *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_828,(internal *)&module.tagsMap._M_h._M_single_bucket,
               (AssertionResult *)0x24efbd,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x87,(char *)auStack_828);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_210,
               (Message *)
               ((long)&result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
               + 0x18));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    std::__cxx11::string::~string((string *)auStack_828);
    if (result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
        != 0) {
      (**(code **)(*(long *)result.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stream);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)&printDefault.fallback);
  ::wasm::TypeBuilder::~TypeBuilder
            ((TypeBuilder *)
             &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(TypeTest, ModuleTypePrinter) {
  TypeBuilder builder(2);
  builder.createRecGroup(0, 2);
  builder[0] = Struct({Field(Type::i32, Immutable)});
  builder[1] = Struct({Field(Type::i32, Immutable)});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  Module module;
  module.typeNames[built[0]] = {"A", {}};

  ModuleTypeNameGenerator printDefault(module);

  std::stringstream stream;
  stream << printDefault(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printDefault(built[1]);
  EXPECT_EQ(stream.str(), "(type $struct.0 (struct (field i32)))");

  using IndexedFallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  IndexedTypeNameGenerator fallback(built);
  ModuleTypeNameGenerator<IndexedFallback> printIndexed(module, fallback);

  stream.str("");
  stream << printIndexed(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printIndexed(built[1]);
  EXPECT_EQ(stream.str(), "(type $1 (struct (field i32)))");
}